

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O0

bool __thiscall LinearGE<1,_0>::propagate(LinearGE<1,_0> *this)

{
  Reason r;
  Reason r_00;
  bool bVar1;
  uint uVar2;
  int64_t iVar3;
  Lit *pLVar4;
  Lit *pLVar5;
  Clause *pCVar6;
  long in_RDI;
  uint j_3;
  uint j_2;
  Reason expl_1;
  int64_t v_1;
  uint i_3;
  uint j_1;
  uint j;
  Reason expl;
  int64_t v;
  uint i_2;
  uint i_1;
  uint i;
  int64_t max_sum;
  vec<Lit> *in_stack_ffffffffffffff08;
  vec<Lit> *in_stack_ffffffffffffff10;
  uint in_stack_ffffffffffffff1c;
  vec<Lit> *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  uint in_stack_ffffffffffffff2c;
  uint in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  uint uVar7;
  anon_union_8_2_743a5d44_for_Reason_0 local_88;
  int local_80;
  uint local_7c;
  int local_78;
  uint local_74;
  anon_union_8_2_743a5d44_for_Reason_0 local_70;
  long local_68;
  uint local_5c;
  anon_union_8_2_743a5d44_for_Reason_0 local_58;
  anon_union_8_2_743a5d44_for_Reason_0 local_50;
  int local_48;
  uint local_44;
  int local_40;
  uint local_3c;
  anon_union_8_2_743a5d44_for_Reason_0 local_38;
  long local_30;
  uint local_24;
  uint local_20;
  uint local_1c;
  long local_18;
  
  local_18 = *(long *)(in_RDI + 0x70);
  for (local_1c = *(uint *)(in_RDI + 100); uVar7 = local_1c,
      uVar2 = vec<IntView<2>_>::size((vec<IntView<2>_> *)(in_RDI + 0x28)), uVar7 < uVar2;
      local_1c = local_1c + 1) {
    vec<IntView<2>_>::operator[]((vec<IntView<2>_> *)(in_RDI + 0x28),local_1c);
    iVar3 = IntView<2>::getMax((IntView<2> *)in_stack_ffffffffffffff10);
    local_18 = iVar3 + local_18;
  }
  for (local_20 = *(uint *)(in_RDI + 0x68); uVar7 = local_20,
      uVar2 = vec<IntView<3>_>::size((vec<IntView<3>_> *)(in_RDI + 0x38)), uVar7 < uVar2;
      local_20 = local_20 + 1) {
    vec<IntView<3>_>::operator[]((vec<IntView<3>_> *)(in_RDI + 0x38),local_20);
    iVar3 = IntView<3>::getMax((IntView<3> *)in_stack_ffffffffffffff10);
    local_18 = iVar3 + local_18;
  }
  for (local_24 = *(uint *)(in_RDI + 100); uVar7 = local_24,
      uVar2 = vec<IntView<2>_>::size((vec<IntView<2>_> *)(in_RDI + 0x28)), uVar7 < uVar2;
      local_24 = local_24 + 1) {
    vec<IntView<2>_>::operator[]((vec<IntView<2>_> *)(in_RDI + 0x28),local_24);
    iVar3 = IntView<2>::getMax((IntView<2> *)in_stack_ffffffffffffff10);
    local_30 = iVar3 - local_18;
    vec<IntView<2>_>::operator[]((vec<IntView<2>_> *)(in_RDI + 0x28),local_24);
    bVar1 = IntView<2>::setMinNotR
                      ((IntView<2> *)in_stack_ffffffffffffff10,(int64_t)in_stack_ffffffffffffff08);
    if (bVar1) {
      Reason::Reason((Reason *)&local_38);
      if ((so.lazy & 1U) != 0) {
        for (local_3c = 0; uVar7 = local_3c,
            uVar2 = vec<IntView<2>_>::size((vec<IntView<2>_> *)(in_RDI + 0x28)), uVar7 < uVar2;
            local_3c = local_3c + 1) {
          vec<IntView<2>_>::operator[]((vec<IntView<2>_> *)(in_RDI + 0x28),local_3c);
          local_40 = (int)IntView<2>::getMaxLit((IntView<2> *)in_stack_ffffffffffffff08);
          pLVar4 = vec<Lit>::operator[]((vec<Lit> *)(in_RDI + 0x78),local_3c);
          pLVar4->x = local_40;
        }
        for (local_44 = 0; uVar7 = local_44,
            uVar2 = vec<IntView<3>_>::size((vec<IntView<3>_> *)(in_RDI + 0x38)), uVar7 < uVar2;
            local_44 = local_44 + 1) {
          vec<IntView<3>_>::operator[]((vec<IntView<3>_> *)(in_RDI + 0x38),local_44);
          local_48 = (int)IntView<3>::getMaxLit((IntView<3> *)in_stack_ffffffffffffff08);
          uVar7 = local_44;
          uVar2 = vec<IntView<2>_>::size((vec<IntView<2>_> *)(in_RDI + 0x28));
          pLVar4 = vec<Lit>::operator[]((vec<Lit> *)(in_RDI + 0x78),uVar7 + uVar2);
          pLVar4->x = local_48;
        }
        pLVar4 = vec<Lit>::operator[]((vec<Lit> *)(in_RDI + 0x78),0);
        pLVar5 = vec<Lit>::operator[]((vec<Lit> *)(in_RDI + 0x78),local_24);
        pLVar5->x = pLVar4->x;
        pCVar6 = Reason_new<vec<Lit>>(in_stack_ffffffffffffff10);
        Reason::Reason((Reason *)&local_50,pCVar6);
        local_38 = local_50;
      }
      vec<IntView<2>_>::operator[]((vec<IntView<2>_> *)(in_RDI + 0x28),local_24);
      local_58 = local_38;
      r.field_0._a._4_4_ = in_stack_ffffffffffffff34;
      r.field_0._a._0_4_ = in_stack_ffffffffffffff30;
      bVar1 = IntView<2>::setMin((IntView<2> *)
                                 CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                                 (int64_t)in_stack_ffffffffffffff20,r,
                                 SUB41(in_stack_ffffffffffffff1c >> 0x18,0));
      if (!bVar1) {
        return false;
      }
    }
  }
  local_5c = *(uint *)(in_RDI + 0x68);
  do {
    uVar7 = local_5c;
    uVar2 = vec<IntView<3>_>::size((vec<IntView<3>_> *)(in_RDI + 0x38));
    if (uVar2 <= uVar7) {
      return true;
    }
    vec<IntView<3>_>::operator[]((vec<IntView<3>_> *)(in_RDI + 0x38),local_5c);
    iVar3 = IntView<3>::getMax((IntView<3> *)in_stack_ffffffffffffff10);
    local_68 = iVar3 - local_18;
    vec<IntView<3>_>::operator[]((vec<IntView<3>_> *)(in_RDI + 0x38),local_5c);
    bVar1 = IntView<3>::setMinNotR
                      ((IntView<3> *)in_stack_ffffffffffffff10,(int64_t)in_stack_ffffffffffffff08);
    if (bVar1) {
      Reason::Reason((Reason *)&local_70);
      if ((so.lazy & 1U) != 0) {
        local_74 = 0;
        while (in_stack_ffffffffffffff30 = local_74,
              uVar2 = vec<IntView<2>_>::size((vec<IntView<2>_> *)(in_RDI + 0x28)),
              in_stack_ffffffffffffff30 < uVar2) {
          vec<IntView<2>_>::operator[]((vec<IntView<2>_> *)(in_RDI + 0x28),local_74);
          local_78 = (int)IntView<2>::getMaxLit((IntView<2> *)in_stack_ffffffffffffff08);
          pLVar4 = vec<Lit>::operator[]((vec<Lit> *)(in_RDI + 0x78),local_74);
          pLVar4->x = local_78;
          local_74 = local_74 + 1;
        }
        local_7c = 0;
        while (in_stack_ffffffffffffff2c = local_7c,
              uVar2 = vec<IntView<3>_>::size((vec<IntView<3>_> *)(in_RDI + 0x38)),
              in_stack_ffffffffffffff2c < uVar2) {
          vec<IntView<3>_>::operator[]((vec<IntView<3>_> *)(in_RDI + 0x38),local_7c);
          local_80 = (int)IntView<3>::getMaxLit((IntView<3> *)in_stack_ffffffffffffff08);
          in_stack_ffffffffffffff20 = (vec<Lit> *)(in_RDI + 0x78);
          in_stack_ffffffffffffff1c = local_7c;
          uVar2 = vec<IntView<2>_>::size((vec<IntView<2>_> *)(in_RDI + 0x28));
          pLVar4 = vec<Lit>::operator[](in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c + uVar2)
          ;
          pLVar4->x = local_80;
          local_7c = local_7c + 1;
        }
        in_stack_ffffffffffffff10 = (vec<Lit> *)vec<Lit>::operator[]((vec<Lit> *)(in_RDI + 0x78),0);
        in_stack_ffffffffffffff08 = (vec<Lit> *)(in_RDI + 0x78);
        uVar2 = vec<IntView<2>_>::size((vec<IntView<2>_> *)(in_RDI + 0x28));
        pLVar4 = vec<Lit>::operator[](in_stack_ffffffffffffff08,uVar2 + local_5c);
        pLVar4->x = in_stack_ffffffffffffff10->sz;
        pCVar6 = Reason_new<vec<Lit>>(in_stack_ffffffffffffff10);
        Reason::Reason((Reason *)&local_88,pCVar6);
        local_70 = local_88;
      }
      vec<IntView<3>_>::operator[]((vec<IntView<3>_> *)(in_RDI + 0x38),local_5c);
      r_00.field_0._a._4_4_ = uVar7;
      r_00.field_0._a._0_4_ = in_stack_ffffffffffffff30;
      bVar1 = IntView<3>::setMin((IntView<3> *)
                                 CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                                 (int64_t)in_stack_ffffffffffffff20,r_00,
                                 SUB41(in_stack_ffffffffffffff1c >> 0x18,0));
      if (!bVar1) {
        return false;
      }
    }
    local_5c = local_5c + 1;
  } while( true );
}

Assistant:

bool propagate() override {
		if ((R != 0) && r.isFalse()) {
			return true;
		}

		int64_t max_sum = fix_sum;

		for (unsigned int i = fix_x; i < x.size(); i++) {
			max_sum += x[i].getMax();
		}
		for (unsigned int i = fix_y; i < y.size(); i++) {
			max_sum += y[i].getMax();
		}

		//		if (R && max_sum < 0) setDom2(r, setVal, 0, x.size()+y.size());

		if ((R != 0) && max_sum < 0) {
			const int64_t v = 0;
			if (r.setValNotR(v != 0)) {
				Reason expl;
				if (so.lazy) {
					for (unsigned int j = 0; j < x.size(); j++) {
						ps[j + 1] = x[j].getMaxLit();
					}
					for (unsigned int j = 0; j < y.size(); j++) {
						ps[j + 1 + x.size()] = y[j].getMaxLit();
					}
					expl = Reason_new(ps);
				}
				if (!r.setVal(v != 0, expl)) {
					return false;
				}
			}
		}

		if ((R != 0) && !r.isTrue()) {
			return true;
		}

		//		for (int i = fix_x; i < x.size(); i++) {
		//			setDom2(x[i], setMin, x[i].getMax()-max_sum, i);
		//		}

		//		for (int i = fix_y; i < y.size(); i++) {
		//			setDom2(y[i], setMin, y[i].getMax()-max_sum, x.size()+i);
		//		}

		for (unsigned int i = fix_x; i < x.size(); i++) {
			const int64_t v = x[i].getMax() - max_sum;
			if (x[i].setMinNotR(v)) {
				Reason expl;
				if (so.lazy) {
					if ((R != 0) && r.isFixed()) {
						ps[0] = r.getValLit();
					}
					for (unsigned int j = 0; j < x.size(); j++) {
						ps[j + R] = x[j].getMaxLit();
					}
					for (unsigned int j = 0; j < y.size(); j++) {
						ps[j + R + x.size()] = y[j].getMaxLit();
					}
					ps[R + i] = ps[0];
					expl = Reason_new(ps);
				}
				if (!x[i].setMin(v, expl)) {
					return false;
				}
			}
		}

		for (unsigned int i = fix_y; i < y.size(); i++) {
			const int64_t v = y[i].getMax() - max_sum;
			if (y[i].setMinNotR(v)) {
				Reason expl;
				if (so.lazy) {
					if ((R != 0) && r.isFixed()) {
						ps[0] = r.getValLit();
					}
					for (unsigned int j = 0; j < x.size(); j++) {
						ps[j + R] = x[j].getMaxLit();
					}
					for (unsigned int j = 0; j < y.size(); j++) {
						ps[j + R + x.size()] = y[j].getMaxLit();
					}
					ps[R + x.size() + i] = ps[0];
					expl = Reason_new(ps);
				}
				if (!y[i].setMin(v, expl)) {
					return false;
				}
			}
		}

		return true;
	}